

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# near_lossless_enc.c
# Opt level: O2

int VP8ApplyNearLossless(WebPPicture *picture,int quality,uint32_t *argb_dst)

{
  uint ysize;
  int iVar1;
  uint32_t *copy_buffer;
  ulong uVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  
  iVar1 = picture->width;
  lVar4 = (long)iVar1;
  ysize = picture->height;
  iVar3 = picture->argb_stride;
  copy_buffer = (uint32_t *)WebPSafeMalloc(lVar4 * 3,4);
  if (copy_buffer == (uint32_t *)0x0) {
    iVar1 = 0;
  }
  else {
    if ((int)ysize < 3 || (int)ysize < 0x40 && iVar1 < 0x40) {
      uVar2 = 0;
      uVar5 = (ulong)ysize;
      if ((int)ysize < 1) {
        uVar5 = uVar2;
      }
      for (; uVar5 != uVar2; uVar2 = uVar2 + 1) {
        memcpy(argb_dst,picture->argb + (long)picture->argb_stride * uVar2,lVar4 * 4);
        argb_dst = argb_dst + lVar4;
      }
    }
    else {
      NearLossless(iVar1,ysize,picture->argb,iVar3,quality / -0x14 + 5,copy_buffer,argb_dst);
      iVar3 = quality / -0x14 + 4;
      while (iVar3 != 0) {
        NearLossless(iVar1,ysize,argb_dst,iVar1,iVar3,copy_buffer,argb_dst);
        iVar3 = iVar3 + -1;
      }
    }
    WebPSafeFree(copy_buffer);
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

int VP8ApplyNearLossless(const WebPPicture* const picture, int quality,
                         uint32_t* const argb_dst) {
  int i;
  const int xsize = picture->width;
  const int ysize = picture->height;
  const int stride = picture->argb_stride;
  uint32_t* const copy_buffer =
      (uint32_t*)WebPSafeMalloc(xsize * 3, sizeof(*copy_buffer));
  const int limit_bits = VP8LNearLosslessBits(quality);
  assert(argb_dst != NULL);
  assert(limit_bits > 0);
  assert(limit_bits <= MAX_LIMIT_BITS);
  if (copy_buffer == NULL) {
    return 0;
  }
  // For small icon images, don't attempt to apply near-lossless compression.
  if ((xsize < MIN_DIM_FOR_NEAR_LOSSLESS &&
       ysize < MIN_DIM_FOR_NEAR_LOSSLESS) ||
      ysize < 3) {
    for (i = 0; i < ysize; ++i) {
      memcpy(argb_dst + i * xsize, picture->argb + i * picture->argb_stride,
             xsize * sizeof(*argb_dst));
    }
    WebPSafeFree(copy_buffer);
    return 1;
  }

  NearLossless(xsize, ysize, picture->argb, stride, limit_bits, copy_buffer,
               argb_dst);
  for (i = limit_bits - 1; i != 0; --i) {
    NearLossless(xsize, ysize, argb_dst, xsize, i, copy_buffer, argb_dst);
  }
  WebPSafeFree(copy_buffer);
  return 1;
}